

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

size_t ans_fold_compress<1u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  array<unsigned_long,_4UL> states;
  ans_fold_encode<1U> ans_frame;
  long *local_a0;
  uint64_t local_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  uint8_t *local_78;
  ans_fold_encode<1U> local_70;
  
  ans_fold_encode<1U>::create(&local_70,src,srcSize);
  local_a0 = (long *)dst;
  local_78 = dst;
  ans_fold_encode<1U>::serialize(&local_70,(uint8_t **)&local_a0);
  local_98 = local_70.lower_bound;
  uStack_90 = local_70.lower_bound;
  uStack_88 = local_70.lower_bound;
  uStack_80 = local_70.lower_bound;
  for (lVar2 = 0; -lVar2 != (ulong)((uint)srcSize & 3); lVar2 = lVar2 + -1) {
    ans_fold_encode<1U>::encode_symbol
              (&local_70,&local_98,src[srcSize + lVar2 + -1],(uint8_t **)&local_a0);
  }
  for (uVar3 = srcSize & 0xfffffffffffffffc; uVar3 != 0; uVar3 = uVar3 - 4) {
    ans_fold_encode<1U>::encode_symbol(&local_70,&local_98,src[uVar3 - 1],(uint8_t **)&local_a0);
    ans_fold_encode<1U>::encode_symbol(&local_70,&uStack_90,src[uVar3 - 2],(uint8_t **)&local_a0);
    ans_fold_encode<1U>::encode_symbol(&local_70,&uStack_88,src[uVar3 - 3],(uint8_t **)&local_a0);
    ans_fold_encode<1U>::encode_symbol(&local_70,&uStack_80,src[uVar3 - 4],(uint8_t **)&local_a0);
  }
  *local_a0 = local_98 - local_70.lower_bound;
  local_a0[1] = uStack_90 - local_70.lower_bound;
  local_a0[2] = uStack_88 - local_70.lower_bound;
  local_a0[3] = uStack_80 - local_70.lower_bound;
  sVar1 = (long)local_a0 + (0x20 - (long)local_78);
  ans_fold_encode<1U>::~ans_fold_encode(&local_70);
  return sVar1;
}

Assistant:

size_t ans_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding, we encode 4 states at the same time for speed
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}